

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_true,_false>::enumerate
          (DaTrie<true,_true,_false> *this,uint32_t node_pos,string *prefix,
          vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  pointer pBVar1;
  bool bVar2;
  uint node_pos_00;
  uint32_t label;
  uint uVar3;
  value_type local_58;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  node_pos_00 = SUB84(pBVar1[node_pos],0);
  if ((int)node_pos_00 < 0) {
    local_58.key._M_dataplus._M_p = (pointer)&local_58.key.field_2;
    local_58.key._M_string_length = 0;
    local_58.key.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&local_58);
    bVar2 = is_terminal_(this,node_pos);
    local_58.value =
         *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_start + node_pos) & 0x7fffffff;
    if (!bVar2) {
      for (; (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[local_58.value] != '\0';
          local_58.value = local_58.value + 1) {
        std::__cxx11::string::push_back((char)&local_58);
      }
      std::__cxx11::string::push_back((char)&local_58);
      local_58.value =
           *(uint32_t *)
            ((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + (local_58.value + 1));
    }
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::push_back(kvs,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    if ((*(uint *)&pBVar1[node_pos_00 & 0x7fffffff].field_0x4 & 0x7fffffff) == node_pos) {
      enumerate(this,node_pos_00,prefix,kvs);
    }
    for (uVar3 = 1; uVar3 != 0x100; uVar3 = uVar3 + 1) {
      if ((*(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3 ^ node_pos_00].field_0x4 & 0x7fffffff)
          == node_pos) {
        std::operator+(&local_58.key,prefix,(char)uVar3);
        enumerate(this,uVar3 ^ node_pos_00,&local_58.key,kvs);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  return;
}

Assistant:

void enumerate(uint32_t node_pos, const std::string& prefix, std::vector<KvPair>& kvs) const {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(!Prefix);

    if (bc_[node_pos].is_leaf()) {
      KvPair kv;
      kv.key = prefix;
      if (is_terminal_(node_pos)) {
        kv.value = bc_[node_pos].value();
      } else {
        auto tail_pos = bc_[node_pos].value();
        while (tail_[tail_pos] != '\0') {
          kv.key += tail_[tail_pos++];
        }
        kv.key += tail_[tail_pos++];
        kv.value = utils::extract_value(tail_.data() + tail_pos);
      }
      kvs.push_back(kv);
      return;
    }

    auto base = bc_[node_pos].base();
    auto child_pos = base ^static_cast<uint8_t>('\0');
    if (bc_[child_pos].check() == node_pos) {
      enumerate(child_pos, prefix, kvs);
    }

    for (uint32_t label = 1; label < 256; ++label) {
      child_pos = base ^ label;
      if (bc_[child_pos].check() == node_pos) {
        enumerate(child_pos, prefix + static_cast<char>(label), kvs);
      }
    }
  }